

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Node * __thiscall capnp::compiler::Compiler::Impl::getBuiltin(Impl *this,Which which)

{
  iterator iVar1;
  Which which_local;
  Fault f;
  uint local_c;
  
  which_local = which;
  iVar1 = std::
          _Rb_tree<capnp::compiler::Declaration::Which,_std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>,_std::_Select1st<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>,_std::less<capnp::compiler::Declaration::Which>,_std::allocator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_>
          ::find(&(this->builtinDeclsByKind)._M_t,&which_local);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header) {
    return (Node *)iVar1._M_node[1]._M_parent;
  }
  local_c = (uint)which_local;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16],unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x4ca,FAILED,"iter != builtinDeclsByKind.end()","\"invalid builtin\", (uint)which",
             (char (*) [16])"invalid builtin",&local_c);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Compiler::Node& Compiler::Impl::getBuiltin(Declaration::Which which) {
  auto iter = builtinDeclsByKind.find(which);
  KJ_REQUIRE(iter != builtinDeclsByKind.end(), "invalid builtin", (uint)which);
  return *iter->second;
}